

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifask(bifcxdef *ctx,int argc)

{
  long lVar1;
  void *p_00;
  int iVar2;
  char *pcVar3;
  int in_ESI;
  long in_RDI;
  runsdef val2;
  uchar *p;
  runsdef val;
  ushort len;
  char **sp;
  ulong flags;
  int file_type;
  int prompt_type;
  int err;
  char pbuf [128];
  char buf [4098];
  uchar *prompt;
  undefined8 in_stack_ffffffffffffeec8;
  int iVar4;
  runcxdef *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffeed8;
  uint below;
  runsdef *val2_00;
  runcxdef *in_stack_ffffffffffffeee8;
  runcxdef *in_stack_ffffffffffffeef0;
  char *in_stack_ffffffffffffeef8;
  bifcxdef *ctx_00;
  char *in_stack_ffffffffffffef08;
  runcxdef *in_stack_ffffffffffffef10;
  undefined1 *local_10e8;
  runsdef *in_stack_ffffffffffffef20;
  anon_union_8_4_1dda36f5_for_runsv in_stack_ffffffffffffef28;
  undefined6 in_stack_ffffffffffffef30;
  ushort uVar5;
  char **in_stack_ffffffffffffef38;
  char **ppcVar6;
  runcxdef *ctx_01;
  int local_10b4;
  int local_10b0;
  runsdef local_1028 [257];
  bifcxdef *local_18;
  int local_c;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20);
  if (((in_ESI != 1) && (in_ESI != 3)) && (in_ESI != 4)) {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffeed0,iVar4);
  }
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffeed0,iVar4);
  }
  ctx_00 = *(bifcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  local_18 = ctx_00;
  local_c = in_ESI;
  local_8 = in_RDI;
  bifcstr(ctx_00,in_stack_ffffffffffffeef8,(size_t)in_stack_ffffffffffffeef0,
          (uchar *)in_stack_ffffffffffffeee8);
  ctx_01 = (runcxdef *)0x0;
  if (local_c < 3) {
    local_10b0 = 1;
    local_10b4 = 1;
    for (ppcVar6 = bifask::save_strs; *ppcVar6 != (char *)0x0; ppcVar6 = ppcVar6 + 1) {
      pcVar3 = bif_stristr(in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0);
      if (pcVar3 != (char *)0x0) {
        local_10b0 = 2;
        break;
      }
    }
    for (in_stack_ffffffffffffef38 = bifask::game_strs;
        iVar4 = (int)((ulong)in_stack_ffffffffffffeef8 >> 0x20),
        *in_stack_ffffffffffffef38 != (char *)0x0;
        in_stack_ffffffffffffef38 = in_stack_ffffffffffffef38 + 1) {
      pcVar3 = bif_stristr(in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0);
      iVar4 = (int)((ulong)in_stack_ffffffffffffeef8 >> 0x20);
      if (pcVar3 == (char *)0x0) {
        local_10b4 = 0xb;
        break;
      }
    }
    if ((local_10b4 == 0xb) && (local_10b0 == 2)) {
      bif_stristr(in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0);
    }
  }
  else {
    lVar1 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar1 + -0x10;
    iVar2 = (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20);
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffeed0,iVar2);
    }
    iVar4 = (int)((ulong)*(undefined8 *)(*(long *)(*(long *)(local_8 + 8) + 0x20) + 8) >> 0x20);
    lVar1 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffeed0,iVar2);
    }
    in_stack_ffffffffffffeef0 = *(runcxdef **)(*(long *)(*(long *)(local_8 + 8) + 0x20) + 8);
    if (local_c == 4) {
      lVar1 = *(long *)(*(long *)(local_8 + 8) + 0x20);
      *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar1 + -0x10;
      if (*(char *)(lVar1 + -0x10) != '\x01') {
        *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
        runsign(in_stack_ffffffffffffeed0,iVar2);
      }
      in_stack_ffffffffffffeee8 = *(runcxdef **)(*(long *)(*(long *)(local_8 + 8) + 0x20) + 8);
      ctx_01 = in_stack_ffffffffffffeee8;
    }
  }
  iVar2 = tio_askfile(in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
                      (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),(int)in_stack_ffffffffffffeec8
                      ,0);
  if (((ulong)ctx_01 & 1) == 0) {
    if (iVar2 == 0) {
      strlen((char *)local_1028);
      runpushcstr(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,(size_t)ctx_00,iVar4);
    }
    else {
      runpnil(in_stack_ffffffffffffeed0);
    }
  }
  else {
    uVar5 = 7;
    if (iVar2 != 0) {
      uVar5 = 8;
    }
    if ((uint)((int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x40) -
              (int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x38)) <= (uint)uVar5) {
      runhcmp(ctx_01,(uint)((ulong)in_stack_ffffffffffffef38 >> 0x20),
              (uint)in_stack_ffffffffffffef38,(runsdef *)CONCAT26(uVar5,in_stack_ffffffffffffef30),
              (runsdef *)in_stack_ffffffffffffef28.runsvstr,in_stack_ffffffffffffef20);
    }
    p_00 = *(void **)(*(long *)(local_8 + 8) + 0x38);
    oswp2(p_00,(uint)uVar5);
    *(undefined1 *)((long)p_00 + 2) = 1;
    oswp4s((void *)((long)p_00 + 3),(long)iVar2);
    local_10e8 = (undefined1 *)((long)p_00 + 7);
    if (iVar2 != 0) {
      local_10e8 = (undefined1 *)((long)p_00 + 8);
      *(undefined1 *)((long)p_00 + 7) = 5;
    }
    *(undefined1 **)(*(long *)(local_8 + 8) + 0x38) = local_10e8;
    runrepush(*(runcxdef **)(local_8 + 8),(runsdef *)&stack0xffffffffffffef20);
    if (iVar2 == 0) {
      below = (uint)((ulong)*(undefined8 *)(local_8 + 8) >> 0x20);
      val2_00 = local_1028;
      strlen((char *)local_1028);
      runpushcstr(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,(size_t)ctx_00,iVar4);
      *(long *)(*(long *)(local_8 + 8) + 0x20) = *(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10;
      *(long *)(*(long *)(local_8 + 8) + 0x20) = *(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10;
      runadd(in_stack_ffffffffffffeef0,(runsdef *)in_stack_ffffffffffffeee8,val2_00,below);
      runrepush(*(runcxdef **)(local_8 + 8),(runsdef *)&stack0xffffffffffffef20);
    }
  }
  return;
}

Assistant:

void bifask(bifcxdef *ctx, int argc)
{
    uchar *prompt;
    char   buf[OSFNMAX + 2];
    char   pbuf[128];
    int    err;
    int    prompt_type;
    int    file_type;
    ulong  flags;

    /* make sure we have an acceptable number of arguments */
    if (argc != 1 && argc != 3 && argc != 4)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* get the first argument - the prompt string */
    prompt = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, pbuf, (size_t)sizeof(pbuf), prompt);

    /* presume we will have no flags */
    flags = 0;

    /* if we have the prompt type and file type parameters, get them */
    if (argc >= 3)
    {
        /* get the prompt-type and the file-type arguments */
        prompt_type = (int)runpopnum(ctx->bifcxrun);
        file_type = (int)runpopnum(ctx->bifcxrun);

        /* if we have a fourth argument, it's the flags */
        if (argc == 4)
            flags = runpopnum(ctx->bifcxrun);
    }
    else
    {
        static const char *save_strs[] =
        {
            "save",
            "write",
            0
        };
        static const char *game_strs[] =
        {
            "restore",
            "game",
            0
        };
        const char **sp;

        /* 
         *   No prompt type or file type were specified.  Try to infer the
         *   dialog type and file type from the text of the prompt.  (This
         *   is mostly to support older games, in particular those based
         *   on older versions of adv.t, since newer games should always
         *   provide explicit values for the file type and dialog type.
         *   We are thus inferring the types based on the prompt strings
         *   that older adv.t's used when calling askfile.)
         *   
         *   If the prompt contains any substring such as "save" or
         *   "write", specify that we're saving; otherwise, assume that
         *   we're opening an existing file for reading.
         *   
         *   If the prompt contains the substrings "restore" AND "game",
         *   assume that we're opening a game file; otherwise, don't make
         *   any assumptions, and use the "unknown" file type.  
         */

        /* presume we're going to open a saved-game file */
        prompt_type = OS_AFP_OPEN;
        file_type = OSFTSAVE;

        /* look for any one of the "save" substrings */
        for (sp = save_strs ; *sp != 0 ; ++sp)
        {
            /* check to see if this substring matches */
            if (bif_stristr(pbuf, *sp))
            {
                /* found it - use the "save" prompt */
                prompt_type = OS_AFP_SAVE;

                /* no need to look any further */
                break;
            }
        }

        /* 
         *   look for *all* of the "restore game" strings - if we fail to
         *   find any of them, be conservative and make no assumptions
         *   about the file type 
         */
        for (sp = game_strs ; *sp != 0 ; ++sp)
        {
            if (bif_stristr(pbuf, *sp) == 0)
            {
                /* 
                 *   this one doesn't match - don't make assumptions about
                 *   the file type 
                 */
                file_type = OSFTUNK;

                /* no need to look any further */
                break;
            }
        }

        /* check for a transcript */
        if (file_type == OSFTUNK
            && prompt_type == OS_AFP_SAVE
            && bif_stristr(pbuf, "script") != 0)
        {
            /* looks like a log file */
            file_type = OSFTLOG;
        }
    }

    /* ask for a file */
    err = tio_askfile(pbuf, buf, (int)sizeof(buf), prompt_type, file_type);

    /* 
     *   if the caller requested extended return codes, return a list
     *   containing the return code as the first element and, if
     *   successful, the string as the second element 
     */
    if ((flags & BIF_ASKF_EXT_RET) != 0)
    {
        ushort len;
        runsdef val;
        uchar *p;
        
        /* 
         *   Allocate space for the starter list - if we have a string to
         *   return, just allocate space for the number element for now;
         *   otherwise, allocate space for the number plus a nil second
         *   element (one byte).
         */
        len = 2 + (1 + 4);
        if (err != OS_AFE_SUCCESS)
            ++len;

        /* allocate the space */
        runhres(ctx->bifcxrun, len, 0);

        /* set up our list pointer */
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = p = ctx->bifcxrun->runcxhp;

        /* write the length prefix */
        oswp2(p, len);
        p += 2;

        /* write the return code as the first element */
        *p++ = DAT_NUMBER;
        oswp4s(p, err);
        p += 4;

        /* write the 'nil' second element if there's an error */
        if (err != OS_AFE_SUCCESS)
            *p++ = DAT_NIL;

        /* commit the list's memory */
        ctx->bifcxrun->runcxhp = p;

        /* push the list */
        runrepush(ctx->bifcxrun, &val);

        /* if we were successful, add the string to the list */
        if (err == OS_AFE_SUCCESS)
        {
            runsdef val2;
            
            /* push the string value, converting to our string format */
            runpushcstr(ctx->bifcxrun, buf, strlen(buf), 1);

            /* add it to the list already on the stack */
            runpop(ctx->bifcxrun, &val2);
            runpop(ctx->bifcxrun, &val);
            runadd(ctx->bifcxrun, &val, &val2, 2);

            /* re-push the result */
            runrepush(ctx->bifcxrun, &val);
        }
    }
    else
    {
        /* 
         *   use the traditional return codes - if askfile failed, return
         *   nil; otherwise, return the filename 
         */
        if (err)
            runpnil(ctx->bifcxrun);
        else
            runpushcstr(ctx->bifcxrun, buf, strlen(buf), 0);
    }
}